

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O3

U32 __thiscall
EnrichableI2cAnalyzer::GenerateSimulationData
          (EnrichableI2cAnalyzer *this,U64 minimum_sample_index,U32 device_sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U32 UVar1;
  
  if (this->mSimulationInitilized == false) {
    UVar1 = Analyzer::GetSimulationSampleRate();
    EnrichableI2cSimulationDataGenerator::Initialize
              (&this->mSimulationDataGenerator,UVar1,(this->mSettings)._M_ptr);
    this->mSimulationInitilized = true;
  }
  UVar1 = EnrichableI2cSimulationDataGenerator::GenerateSimulationData
                    (&this->mSimulationDataGenerator,minimum_sample_index,device_sample_rate,
                     simulation_channels);
  return UVar1;
}

Assistant:

U32 EnrichableI2cAnalyzer::GenerateSimulationData( U64 minimum_sample_index, U32 device_sample_rate, SimulationChannelDescriptor** simulation_channels )
{
	if( mSimulationInitilized == false )
	{
		mSimulationDataGenerator.Initialize( GetSimulationSampleRate(), mSettings.get() );
		mSimulationInitilized = true;
	}

	return mSimulationDataGenerator.GenerateSimulationData( minimum_sample_index, device_sample_rate, simulation_channels );
}